

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

Lhs * __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::pop(Lhs *__return_storage_ptr__,
     SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
     *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Clause *pCVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  Node *pNVar10;
  ulong uVar11;
  undefined4 uVar12;
  
  pCVar6 = (Clause *)this->_left->nodes[0];
  uVar3 = this->_top;
  uVar8 = 1;
  uVar9 = uVar8;
  if (1 < uVar3) {
    pNVar10 = this->_left + 1;
    do {
      uVar9 = uVar8;
      if ((pNVar10->value).super_SelectedSummand.super_SelectedLiteral.cl != pCVar6) break;
      uVar8 = uVar8 + 1;
      pNVar10 = (Node *)&(pNVar10->value).super_SelectedSummand.super_SelectedLiteral.litIdx;
      uVar9 = uVar3;
    } while (uVar3 != uVar8);
  }
  uVar11 = 0;
  do {
    this->_left->nodes[uVar11] = (Node *)pCVar6->_literals[uVar11 + 0xfffffffffffffff8];
    uVar11 = uVar11 + 1;
  } while (uVar9 != uVar11);
  bVar1 = (((Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             *)&(pCVar6->super_Unit)._inference.field_0x4)->
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          )._isSome;
  if (bVar1 == false) {
    uVar12 = *(undefined4 *)((long)&(pCVar6->super_Unit)._inference._ptr2 + 4);
    (__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.litIdx =
         *(uint *)&(pCVar6->super_Unit)._inference.field_0x0;
    (__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.cl =
         (((SelectedSummand *)&(pCVar6->super_Unit)._number)->super_SelectedLiteral).cl;
  }
  else {
    bVar2 = *(byte *)&((MaybeUninit<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                        *)&(pCVar6->super_Unit)._inference.field_0x8)->_elem;
    uVar4 = *(undefined4 *)((long)&(pCVar6->super_Unit)._inference._ptr1 + 1);
    uVar7 = *(undefined8 *)((long)&(pCVar6->super_Unit)._inference._splits + 1);
    uVar5 = *(undefined4 *)&(pCVar6->super_Unit)._inference.field_0x9;
    uVar12 = *(undefined4 *)((long)&(pCVar6->super_Unit)._inference._ptr2 + 4);
    (__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.litIdx =
         *(uint *)&(pCVar6->super_Unit)._inference.field_0x0;
    (__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.cl =
         (((SelectedSummand *)&(pCVar6->super_Unit)._number)->super_SelectedLiteral).cl;
    *(undefined8 *)
     &(__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 8) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 0xc) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 0x14) = 0;
    *(byte *)&(__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem = bVar2 & 3;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 1) = uVar5;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 9) = uVar7;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 0x11) = uVar4;
  }
  (__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.interpreted.
  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ._isSome = bVar1;
  *(undefined4 *)&(__return_storage_ptr__->super_SelectedSummand).super_SelectedLiteral.field_0x2c =
       uVar12;
  uVar11 = (ulong)(uVar9 - 1) * 8 + 0x47 & 0xffffffff0;
  if (uVar11 == 0) {
    (((SelectedSummand *)&(pCVar6->super_Unit)._number)->super_SelectedLiteral).cl =
         (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pCVar6;
  }
  else if (uVar11 < 0x11) {
    (((SelectedSummand *)&(pCVar6->super_Unit)._number)->super_SelectedLiteral).cl =
         (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar6;
  }
  else if (uVar11 < 0x19) {
    (((SelectedSummand *)&(pCVar6->super_Unit)._number)->super_SelectedLiteral).cl =
         (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pCVar6;
  }
  else if (uVar11 < 0x21) {
    (((SelectedSummand *)&(pCVar6->super_Unit)._number)->super_SelectedLiteral).cl =
         (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pCVar6;
  }
  else if (uVar11 < 0x31) {
    (((SelectedSummand *)&(pCVar6->super_Unit)._number)->super_SelectedLiteral).cl =
         (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pCVar6;
  }
  else if (uVar11 < 0x41) {
    (((SelectedSummand *)&(pCVar6->super_Unit)._number)->super_SelectedLiteral).cl =
         (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pCVar6;
  }
  else {
    operator_delete(pCVar6,0x10);
  }
  return __return_storage_ptr__;
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }